

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  sqlite3 *db;
  sqlite3_int64 nAlloc;
  SrcList *pNew;
  int i;
  int iStart_local;
  int nExtra_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  _iStart_local = pSrc;
  if (pSrc->nAlloc < (uint)(pSrc->nSrc + nExtra)) {
    db = (sqlite3 *)((long)pSrc->nSrc * 2 + (long)nExtra);
    if (199 < pSrc->nSrc + nExtra) {
      sqlite3ErrorMsg(pParse,"too many FROM clause terms, max: %d",200);
      return (SrcList *)0x0;
    }
    if (200 < (long)db) {
      db = (sqlite3 *)0xc8;
    }
    _iStart_local =
         (SrcList *)
         sqlite3DbRealloc(pParse->db,pSrc,(long)((long)&db[-1].pDbData + 7) * 0x68 + 0x70);
    if (_iStart_local == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    _iStart_local->nAlloc = (u32)db;
  }
  pNew._4_4_ = _iStart_local->nSrc;
  while (pNew._4_4_ = pNew._4_4_ + -1, iStart <= pNew._4_4_) {
    memcpy(_iStart_local->a + (pNew._4_4_ + nExtra),_iStart_local->a + pNew._4_4_,0x68);
  }
  _iStart_local->nSrc = nExtra + _iStart_local->nSrc;
  memset(_iStart_local->a + iStart,0,(long)nExtra * 0x68);
  for (pNew._4_4_ = iStart; pNew._4_4_ < iStart + nExtra; pNew._4_4_ = pNew._4_4_ + 1) {
    _iStart_local->a[pNew._4_4_].iCursor = -1;
  }
  return _iStart_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}